

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * __thiscall fs::Path::setExtension(Path *this,string *string)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *string_local;
  Path *this_local;
  
  local_18 = string;
  string_local = &this->_complete;
  std::__cxx11::string::operator=((string *)&this->_extension,(string *)string);
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)&this->_extension);
  if (*pcVar1 != '.') {
    std::operator+(&local_38,'.',&this->_extension);
    std::__cxx11::string::operator=((string *)&this->_extension,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  updateFile(this);
  return this;
}

Assistant:

fs::Path& fs::Path::setExtension(std::string const& string)
{
  _extension = string;
  if (_extension[0] != '.')
    _extension = '.' + _extension;
  updateFile();
  return *this;
}